

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_dynamic_suite::dynamic_push_back(void)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  initializer_list<int> input;
  initializer_list<int> __l;
  iterator first_begin;
  allocator_type local_91;
  iterator local_90;
  vector<int,_std::allocator<int>_> expect;
  int local_68 [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input._M_len = 3;
  input._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  vista::circular_view<int,_18446744073709551615UL>::push_back(&span,0x2c);
  local_68[0] = 0xb;
  local_68[1] = 0x16;
  local_68[2] = 0x21;
  local_68[3] = 0x2c;
  __l._M_len = 4;
  __l._M_array = local_68;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_91);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_90 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  second_end._M_current._4_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x153,"void api_dynamic_suite::dynamic_push_back()",first_begin,local_90,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,second_end);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void dynamic_push_back()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33};
    span.push_back(44);
    {
        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}